

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.h
# Opt level: O1

bool __thiscall ByteCodeGenerator::HasInterleavingDynamicScope(ByteCodeGenerator *this,Symbol *sym)

{
  Scope *symScope;
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *this_00;
  Type *ppFVar1;
  Scope *pSVar2;
  Type funcInfo;
  PropertyId local_1c [2];
  PropertyId unused;
  
  if (this->dynamicScopeCount != 0) {
    symScope = sym->scope;
    this_00 = this->funcInfoStack;
    if ((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
        (this_00->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
        super_SListNodeBase<Memory::ArenaAllocator>.next == this_00) {
      funcInfo = (FuncInfo *)0x0;
    }
    else {
      ppFVar1 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                          (&this_00->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>)
      ;
      funcInfo = *ppFVar1;
    }
    pSVar2 = FindScopeForSym(this,symScope,(Scope *)0x0,local_1c,funcInfo);
    return symScope != pSVar2;
  }
  return false;
}

Assistant:

bool InDynamicScope() const { return dynamicScopeCount != 0; }